

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::copy_symlink(path *existing_symlink,path *new_symlink,error_code *ec)

{
  bool bVar1;
  undefined1 local_40 [8];
  path to;
  error_code *ec_local;
  path *new_symlink_local;
  path *existing_symlink_local;
  
  to._path.field_2._8_8_ = ec;
  std::error_code::clear(ec);
  read_symlink((path *)local_40,existing_symlink,(error_code *)to._path.field_2._8_8_);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)to._path.field_2._8_8_);
  if (!bVar1) {
    bVar1 = exists((path *)local_40,(error_code *)to._path.field_2._8_8_);
    if ((bVar1) &&
       (bVar1 = is_directory((path *)local_40,(error_code *)to._path.field_2._8_8_), bVar1)) {
      create_directory_symlink((path *)local_40,new_symlink,(error_code *)to._path.field_2._8_8_);
    }
    else {
      create_symlink((path *)local_40,new_symlink,(error_code *)to._path.field_2._8_8_);
    }
  }
  path::~path((path *)local_40);
  return;
}

Assistant:

GHC_INLINE void copy_symlink(const path& existing_symlink, const path& new_symlink, std::error_code& ec) noexcept
{
    ec.clear();
    auto to = read_symlink(existing_symlink, ec);
    if (!ec) {
        if (exists(to, ec) && is_directory(to, ec)) {
            create_directory_symlink(to, new_symlink, ec);
        }
        else {
            create_symlink(to, new_symlink, ec);
        }
    }
}